

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O2

void jas_matrix_clip(jas_matrix_t *matrix,jas_seqent_t minval,jas_seqent_t maxval)

{
  jas_seqent_t **ppjVar1;
  size_t sVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  jas_seqent_t jVar6;
  long lVar7;
  
  lVar7 = matrix->numrows_;
  if ((0 < lVar7) && (0 < matrix->numcols_)) {
    ppjVar1 = matrix->rows_;
    if (ppjVar1 == (jas_seqent_t **)0x0) {
      __assert_fail("matrix->rows_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                    ,0x133,"void jas_matrix_clip(jas_matrix_t *, jas_seqent_t, jas_seqent_t)");
    }
    sVar2 = jas_matrix_rowstep(matrix);
    plVar3 = *ppjVar1;
    for (; 0 < lVar7; lVar7 = lVar7 + -1) {
      plVar5 = plVar3;
      for (lVar4 = matrix->numcols_; 0 < lVar4; lVar4 = lVar4 + -1) {
        jVar6 = minval;
        if ((*plVar5 < minval) || (jVar6 = maxval, maxval < *plVar5)) {
          *plVar5 = jVar6;
        }
        plVar5 = plVar5 + 1;
      }
      plVar3 = plVar3 + sVar2;
    }
  }
  return;
}

Assistant:

void jas_matrix_clip(jas_matrix_t *matrix, jas_seqent_t minval,
  jas_seqent_t maxval)
{
	jas_matind_t i;
	jas_matind_t j;
	jas_seqent_t v;
	jas_seqent_t *rowstart;
	jas_seqent_t *data;
	jas_matind_t rowstep;

	if (jas_matrix_numrows(matrix) > 0 && jas_matrix_numcols(matrix) > 0) {
		assert(matrix->rows_);
		rowstep = jas_matrix_rowstep(matrix);
		for (i = matrix->numrows_, rowstart = matrix->rows_[0]; i > 0; --i,
		  rowstart += rowstep) {
			data = rowstart;
			for (j = matrix->numcols_, data = rowstart; j > 0; --j,
			  ++data) {
				v = *data;
				if (v < minval) {
					*data = minval;
				} else if (v > maxval) {
					*data = maxval;
				}
			}
		}
	}
}